

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

uint32_t __thiscall fmp4_stream::init_fragment::get_time_scale(init_fragment *this)

{
  pointer in;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ostream *poVar5;
  uint uVar6;
  allocator<char> local_a1;
  pointer local_a0;
  pointer local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_a0 = (this->moov_box_).box_data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_98 = local_a0 + 4;
  uVar4 = 8;
  bVar2 = false;
  do {
    in = local_98 + uVar4;
    do {
      if (bVar2 != false) {
        uVar6 = (int)uVar4 + 8;
        bVar2 = false;
        goto LAB_0010adfe;
      }
      if ((ulong)((long)(this->moov_box_).box_data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->moov_box_).box_data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) <= uVar4) goto LAB_0010aedc;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"trak",&local_a1);
      bVar2 = f_compare_4cc((char *)in,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    } while (bVar2);
    uVar6 = *(uint *)(local_a0 + uVar4);
    uVar4 = (ulong)((uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18
                    ) + (int)uVar4);
  } while( true );
LAB_0010adfe:
  if (bVar2) {
    uVar6 = uVar6 + 8;
    bVar2 = false;
    while( true ) {
      uVar4 = (ulong)uVar6;
      if (bVar2) {
        if (local_a0[uVar6 + 8] == '\x01') {
          uVar6 = *(uint *)(local_a0 + uVar4 + 0x1c);
        }
        else {
          uVar6 = *(uint *)(local_a0 + uVar4 + 0x14);
        }
        return uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      }
      if ((ulong)((long)(this->moov_box_).box_data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->moov_box_).box_data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) <= uVar4) break;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"mdhd",&local_a1);
      bVar3 = f_compare_4cc((char *)(local_98 + uVar4),&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (bVar3) {
        bVar2 = true;
      }
      else {
        uVar1 = *(uint *)(local_a0 + uVar4);
        uVar6 = uVar6 + (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        uVar1 << 0x18);
      }
    }
LAB_0010aedc:
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "warning no mdhd box found, required for event message track format");
    std::endl<char,std::char_traits<char>>(poVar5);
    return 1;
  }
  uVar4 = (ulong)uVar6;
  if ((ulong)((long)(this->moov_box_).box_data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->moov_box_).box_data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) <= uVar4) goto LAB_0010aedc;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"mdia",&local_a1);
  bVar3 = f_compare_4cc((char *)(local_98 + uVar4),&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (bVar3) {
    bVar2 = true;
  }
  else {
    uVar1 = *(uint *)(local_a0 + uVar4);
    uVar6 = uVar6 + (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
                    );
  }
  goto LAB_0010adfe;
}

Assistant:

uint32_t init_fragment::get_time_scale()
	{
		char *ptr = (char*)moov_box_.box_data_.data();

		bool trak_found = false;
		bool mdia_found = false;
		bool mdhd_found = false;
		uint32_t timescale = 1;

		uint32_t pos = 8;

		// find trak box 
		while (!trak_found && pos < moov_box_.box_data_.size())
		{
			if (f_compare_4cc(ptr + 4 + pos, "trak"))
				trak_found = true;
			else
				pos += fmp4_read_uint32(ptr + pos);
		}
		if (trak_found)
		{
			pos += 8;
			while(!mdia_found && pos < moov_box_.box_data_.size())
			{
				if (f_compare_4cc(ptr + 4 + pos, "mdia"))
					mdia_found = true;
				else
					pos += fmp4_read_uint32(ptr + pos);
			};
		}
		if (mdia_found)
		{
			pos += 8;
			while (!mdhd_found && pos < moov_box_.box_data_.size())
			{
				if (f_compare_4cc(ptr + 4 + pos, "mdhd"))
					mdhd_found = true;
				else
					pos += fmp4_read_uint32(ptr + pos);
			};
		}
		if (mdhd_found)
		{
			uint8_t version = (uint8_t)ptr[pos + 8];
			if (version == 1)
				timescale = fmp4_read_uint32(ptr + pos + 28);
			else
				timescale = fmp4_read_uint32(ptr + pos + 20);
			
			return timescale;
		}
		else
		    std::cout << "warning no mdhd box found, required for event message track format" << std::endl;
		    return timescale;
	
	}